

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O2

void aec_get_rsi_msb_24(aec_stream *strm)

{
  uint32_t *puVar1;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  puVar1 = strm->state->data_raw;
  puVar2 = strm->next_in;
  uVar3 = strm->block_size * strm->rsi;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  pbVar6 = puVar2 + 2;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    puVar1[uVar4] = (uint)*pbVar6 | (uint)pbVar6[-1] << 8 | (uint)pbVar6[-2] << 0x10;
    pbVar6 = pbVar6 + 3;
  }
  strm->next_in = puVar2 + (int)(uVar3 * 3);
  strm->avail_in = strm->avail_in - (long)(int)(uVar3 * 3);
  return;
}

Assistant:

void aec_get_rsi_msb_24(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = ((uint32_t)in[3 * i] << 16)
            | ((uint32_t)in[3 * i + 1] << 8)
            | (uint32_t)in[3 * i + 2];

    strm->next_in += 3 * rsi;
    strm->avail_in -= 3 * rsi;
}